

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::_longUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  bool bVar1;
  Arg *this_00;
  ulong uVar2;
  size_type sVar3;
  reference ppAVar4;
  void *this_01;
  reference ppAVar5;
  Arg *in_RDX;
  long *in_RSI;
  undefined8 in_RDI;
  ArgListIterator it_1;
  ArgVectorIterator it;
  int i;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  XorHandler xorHandler;
  string message;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  Arg *in_stack_fffffffffffffdb8;
  XorHandler *in_stack_fffffffffffffdc0;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  *in_stack_fffffffffffffdc8;
  Arg *pAVar6;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  *in_stack_fffffffffffffdd0;
  Arg *in_stack_fffffffffffffdf0;
  Arg *in_stack_fffffffffffffdf8;
  Arg *in_stack_fffffffffffffe00;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  *in_stack_fffffffffffffe08;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  *in_stack_fffffffffffffe10;
  int secondLineOffset;
  _Self in_stack_fffffffffffffe30;
  ostream *in_stack_fffffffffffffe38;
  StdOutput *in_stack_fffffffffffffe40;
  undefined1 local_1a1 [33];
  string local_180 [32];
  _Self local_160;
  _Self local_158;
  Arg **local_150;
  allocator<char> local_141;
  string local_140 [32];
  Arg **local_120;
  Arg **local_118;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [32];
  string local_c8 [32];
  Arg **local_a8;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_a0;
  uint local_94;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  local_90;
  XorHandler local_78;
  string local_50 [56];
  Arg *local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x58))();
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)in_stack_fffffffffffffe00,
             (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)in_stack_fffffffffffffdf8);
  this_00 = (Arg *)(**(code **)(*local_10 + 0x70))();
  std::__cxx11::string::string(local_50,(string *)this_00);
  (**(code **)(*local_10 + 0x60))();
  XorHandler::XorHandler(in_stack_fffffffffffffdc0,(XorHandler *)in_stack_fffffffffffffdb8);
  XorHandler::getXorList(&local_78);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  local_94 = 0;
  while( true ) {
    uVar2 = (ulong)local_94;
    sVar3 = std::
            vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            ::size(&local_90);
    if (sVar3 <= uVar2) break;
    std::
    vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
    ::operator[](&local_90,(long)(int)local_94);
    local_a0._M_current =
         (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                           ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
                            in_stack_fffffffffffffdb8);
    while( true ) {
      std::
      vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ::operator[](&local_90,(long)(int)local_94);
      local_a8 = (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                                   ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
                                    in_stack_fffffffffffffdb8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                          *)in_stack_fffffffffffffdc0,
                         (__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                          *)in_stack_fffffffffffffdb8);
      if (!bVar1) break;
      in_stack_fffffffffffffdf8 = local_18;
      ppAVar4 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_a0);
      in_stack_fffffffffffffe00 = *ppAVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                 (allocator<char> *)in_stack_fffffffffffffdf0);
      (*in_stack_fffffffffffffe00->_vptr_Arg[9])(local_c8,in_stack_fffffffffffffe00,local_e8);
      spacePrint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (string *)in_stack_fffffffffffffe30._M_node,(int)((ulong)this_00 >> 0x20),
                 (int)this_00,(int)((ulong)in_RDI >> 0x20));
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator(&local_e9);
      in_stack_fffffffffffffdf0 = local_18;
      __gnu_cxx::
      __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>::
      operator*(&local_a0);
      Arg::getDescription_abi_cxx11_(this_00);
      spacePrint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (string *)in_stack_fffffffffffffe30._M_node,(int)((ulong)this_00 >> 0x20),
                 (int)this_00,(int)((ulong)in_RDI >> 0x20));
      std::__cxx11::string::~string(local_110);
      local_118 = (Arg **)__gnu_cxx::
                          __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                          ::operator+(in_stack_fffffffffffffdc8,
                                      (difference_type)in_stack_fffffffffffffdc0);
      std::
      vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
      ::operator[](&local_90,(long)(int)local_94);
      local_120 = (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                                    ((vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
                                     in_stack_fffffffffffffdb8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                          *)in_stack_fffffffffffffdc0,
                         (__normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                          *)in_stack_fffffffffffffdb8);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                   (allocator<char> *)in_stack_fffffffffffffdf0);
        spacePrint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                   (string *)in_stack_fffffffffffffe30._M_node,(int)((ulong)this_00 >> 0x20),
                   (int)this_00,(int)((ulong)in_RDI >> 0x20));
        std::__cxx11::string::~string(local_140);
        std::allocator<char>::~allocator(&local_141);
      }
      local_150 = (Arg **)__gnu_cxx::
                          __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                          ::operator++(in_stack_fffffffffffffdc8,
                                       (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
    }
    this_01 = (void *)std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    local_94 = local_94 + 1;
  }
  local_158._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                 ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)in_stack_fffffffffffffdb8);
  while( true ) {
    local_160._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                   ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)in_stack_fffffffffffffdb8);
    bVar1 = std::operator!=(&local_158,&local_160);
    secondLineOffset = (int)((ulong)in_RDI >> 0x20);
    if (!bVar1) break;
    std::_List_iterator<TCLAP::Arg_*>::operator*((_List_iterator<TCLAP::Arg_*> *)0x12b033);
    bVar1 = XorHandler::contains((XorHandler *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    if (!bVar1) {
      ppAVar5 = std::_List_iterator<TCLAP::Arg_*>::operator*
                          ((_List_iterator<TCLAP::Arg_*> *)0x12b065);
      pAVar6 = *ppAVar5;
      in_stack_fffffffffffffdd0 =
           (vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)local_1a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                 (allocator<char> *)in_stack_fffffffffffffdf0);
      (*pAVar6->_vptr_Arg[9])(local_180,pAVar6,local_1a1 + 1);
      spacePrint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (string *)in_stack_fffffffffffffe30._M_node,(int)((ulong)this_00 >> 0x20),
                 (int)this_00,(int)((ulong)in_RDI >> 0x20));
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string((string *)(local_1a1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1a1);
      in_stack_fffffffffffffdb8 = local_18;
      std::_List_iterator<TCLAP::Arg_*>::operator*((_List_iterator<TCLAP::Arg_*> *)0x12b121);
      Arg::getDescription_abi_cxx11_(this_00);
      spacePrint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (string *)in_stack_fffffffffffffe30._M_node,(int)((ulong)this_00 >> 0x20),
                 (int)this_00,(int)((ulong)in_RDI >> 0x20));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
      std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
    }
    in_stack_fffffffffffffe30 = std::_List_iterator<TCLAP::Arg_*>::operator++(&local_158,0);
  }
  std::ostream::operator<<(local_18,std::endl<char,std::char_traits<char>>);
  spacePrint(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (string *)in_stack_fffffffffffffe30._M_node,(int)((ulong)this_00 >> 0x20),(int)this_00,
             secondLineOffset);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector(in_stack_fffffffffffffdd0);
  XorHandler::~XorHandler((XorHandler *)0x12b288);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)0x12b2a2);
  return;
}

Assistant:

inline void 
StdOutput::_longUsage( CmdLineInterface& _cmd, 
					   std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string message = _cmd.getMessage();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	// first the xor 
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); 
				  it++ )
				{
					spacePrint( os, (*it)->longID(), 75, 3, 3 );
					spacePrint( os, (*it)->getDescription(), 75, 5, 0 );

					if ( it+1 != xorList[i].end() )
						spacePrint(os, "-- OR --", 75, 9, 0);
				}
			os << std::endl << std::endl;
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			{
				spacePrint( os, (*it)->longID(), 75, 3, 3 ); 
				spacePrint( os, (*it)->getDescription(), 75, 5, 0 ); 
				os << std::endl;
			}

	os << std::endl;

	spacePrint( os, message, 75, 3, 0 );
}